

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_instructions.cpp
# Opt level: O0

ir_constant *
anon_unknown.dwarf_4837a::lower_instructions_visitor::_imm_fp
          (void *mem_ctx,glsl_type *type,double f,uint vector_elements)

{
  char cVar1;
  ir_constant *piVar2;
  float16_t local_2e;
  uint local_2c;
  double dStack_28;
  uint vector_elements_local;
  double f_local;
  glsl_type *type_local;
  void *mem_ctx_local;
  
  cVar1 = type->field_0x4;
  local_2c = vector_elements;
  dStack_28 = f;
  f_local = (double)type;
  type_local = (glsl_type *)mem_ctx;
  if (cVar1 == '\x02') {
    piVar2 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(piVar2,(float)dStack_28,local_2c);
    mem_ctx_local = piVar2;
  }
  else if (cVar1 == '\x03') {
    piVar2 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    float16_t::float16_t(&local_2e,dStack_28);
    ir_constant::ir_constant(piVar2,local_2e,local_2c);
    mem_ctx_local = piVar2;
  }
  else {
    if (cVar1 != '\x04') {
      __assert_fail("!\"unknown float type for immediate\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_instructions.cpp"
                    ,0x604,
                    "static ir_constant *(anonymous namespace)::lower_instructions_visitor::_imm_fp(void *, const glsl_type *, double, unsigned int)"
                   );
    }
    piVar2 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(piVar2,dStack_28,local_2c);
    mem_ctx_local = piVar2;
  }
  return (ir_constant *)mem_ctx_local;
}

Assistant:

ir_constant *
lower_instructions_visitor::_imm_fp(void *mem_ctx,
                                    const glsl_type *type,
                                    double f,
                                    unsigned vector_elements)
{
   switch (type->base_type) {
   case GLSL_TYPE_FLOAT:
      return new(mem_ctx) ir_constant((float) f, vector_elements);
   case GLSL_TYPE_DOUBLE:
      return new(mem_ctx) ir_constant((double) f, vector_elements);
   case GLSL_TYPE_FLOAT16:
      return new(mem_ctx) ir_constant(float16_t(f), vector_elements);
   default:
      assert(!"unknown float type for immediate");
      return NULL;
   }
}